

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt tt_cmap14_char_var_index
                  (TT_CMap cmap,TT_CMap ucmap,FT_UInt32 charcode,FT_UInt32 variantSelector)

{
  uint uVar1;
  FT_Byte *pFVar2;
  FT_UInt FVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  
  pFVar2 = cmap->data;
  puVar4 = (uint *)tt_cmap14_find_variant(pFVar2 + 6,variantSelector);
  if (puVar4 != (uint *)0x0) {
    uVar5 = *puVar4;
    uVar1 = puVar4[1];
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (uVar5 != 0) {
      FVar3 = tt_cmap14_char_map_def_binary(pFVar2 + uVar5,charcode);
      if (FVar3 != 0) {
        FVar3 = (*((ucmap->cmap).clazz)->char_index)(&ucmap->cmap,charcode);
        return FVar3;
      }
    }
    uVar6 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    if (uVar6 != 0) {
      FVar3 = tt_cmap14_char_map_nondef_binary(pFVar2 + uVar6,charcode);
      return FVar3;
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap14_char_var_index( TT_CMap    cmap,
                            TT_CMap    ucmap,
                            FT_UInt32  charcode,
                            FT_UInt32  variantSelector )
  {
    FT_Byte*  p = tt_cmap14_find_variant( cmap->data + 6, variantSelector );
    FT_ULong  defOff;
    FT_ULong  nondefOff;


    if ( !p )
      return 0;

    defOff    = TT_NEXT_ULONG( p );
    nondefOff = TT_PEEK_ULONG( p );

    if ( defOff != 0                                                    &&
         tt_cmap14_char_map_def_binary( cmap->data + defOff, charcode ) )
    {
      /* This is the default variant of this charcode.  GID not stored */
      /* here; stored in the normal Unicode charmap instead.           */
      return ucmap->cmap.clazz->char_index( &ucmap->cmap, charcode );
    }

    if ( nondefOff != 0 )
      return tt_cmap14_char_map_nondef_binary( cmap->data + nondefOff,
                                               charcode );

    return 0;
  }